

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall StringInstance::StringInstance(StringInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  ulong in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  string local_88 [32];
  string local_68 [15];
  char in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  allocator local_31;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"String",&local_31);
  Instance::Instance((Instance *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *(undefined ***)in_RDI = &PTR__StringInstance_0020edf0;
  std::__cxx11::string::string((string *)(in_RDI + 0x58));
  bVar1 = Grammar::is_string_value(in_RDI);
  if (!bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_88,local_10);
  str_utils::unescape(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x58),local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

StringInstance::StringInstance(const std::string& value) : Instance("String") {
    if (!Grammar::is_string_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = str_utils::unescape(value.substr(1, int(value.size()) - 2), '"');
}